

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  ushort uVar2;
  Pgno PVar3;
  MemPage *pPage;
  u8 *puVar4;
  Btree *pBVar5;
  uchar *puVar6;
  DbPage *pDbPage_00;
  int iVar7;
  u32 pgno;
  Pgno *pPVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  BtCursor *pBVar12;
  long lVar13;
  u32 uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  Pgno nextPage;
  uint local_64;
  uchar *local_60;
  BtCursor *local_58;
  BtShared *local_50;
  int local_44;
  ulong local_40;
  DbPage *pDbPage;
  
  uVar18 = (ulong)amt;
  pPage = pCur->apPage[pCur->iPage];
  local_50 = pCur->pBt;
  if ((pCur->info).nSize == 0) {
    btreeParseCell(pPage,(uint)pCur->aiIdx[pCur->iPage],&pCur->info);
    pCur->validNKey = '\x01';
  }
  iVar7 = 0;
  if (pPage->intKey == '\0') {
    iVar7 = (int)(pCur->info).nKey;
  }
  iVar16 = 0xd11c;
  if (iVar7 + (pCur->info).nData < amt + offset) goto LAB_0012bec4;
  uVar1 = (pCur->info).nHeader;
  puVar4 = (pCur->info).pCell;
  uVar2 = (pCur->info).nLocal;
  local_60 = pBuf;
  if (pPage->aData + local_50->usableSize < puVar4 + (ulong)uVar2 + (ulong)uVar1) goto LAB_0012bec4;
  uVar9 = (uint)uVar2;
  if (uVar9 < offset || uVar9 - offset == 0) {
    uVar10 = (ulong)(offset - uVar9);
    iVar7 = 0;
  }
  else {
    uVar14 = uVar9 - offset;
    if (amt + offset <= (uint)uVar2) {
      uVar14 = amt;
    }
    local_58 = pCur;
    iVar7 = copyPayload(puVar4 + (ulong)offset + (ulong)uVar1,pBuf,uVar14,eOp,pPage->pDbPage);
    local_60 = pBuf + (int)uVar14;
    uVar18 = (ulong)(amt - uVar14);
    uVar10 = 0;
    pCur = local_58;
  }
  if ((iVar7 == 0) && ((int)uVar18 != 0)) {
    uVar14 = local_50->usableSize;
    local_64 = uVar14 - 4;
    uVar2 = (pCur->info).nLocal;
    pgno = sqlite3Get4byte(puVar4 + (ulong)uVar2 + (ulong)uVar1);
    uVar9 = local_64;
    pPVar8 = pCur->aOverflow;
    nextPage = pgno;
    if (pCur->isIncrblobHandle == '\0') {
      iVar7 = 0;
LAB_0012bd59:
      if (pPVar8 != (Pgno *)0x0) goto LAB_0012bd62;
      lVar13 = 0;
    }
    else {
      if (pPVar8 == (Pgno *)0x0) {
        uVar15 = ((uVar14 - uVar2) + (pCur->info).nPayload) - 5;
        pPVar8 = (Pgno *)sqlite3MallocZero((uVar15 / local_64) * 4);
        pCur->aOverflow = pPVar8;
        iVar7 = 7;
        if (pPVar8 != (Pgno *)0x0) {
          iVar7 = 0;
        }
        if (uVar15 < uVar9) {
          iVar7 = 0;
        }
        goto LAB_0012bd59;
      }
      iVar7 = 0;
LAB_0012bd62:
      lVar13 = 0;
      uVar17 = uVar10 / uVar9;
      if (pPVar8[uVar17] != 0) {
        lVar13 = (long)(int)uVar17;
        pgno = pPVar8[lVar13];
        uVar10 = uVar10 % (ulong)uVar9;
        nextPage = pgno;
      }
    }
    local_58 = (BtCursor *)&pCur->aOverflow;
    local_44 = (uint)(eOp == 0) * 2;
    pBVar12 = local_58;
    lVar13 = lVar13 * 4;
    while (((lVar11 = lVar13 + 4, iVar7 == 0 && ((int)uVar18 != 0)) && (pgno != 0))) {
      pBVar5 = pBVar12->pBtree;
      uVar15 = (uint)uVar10;
      if (pBVar5 == (Btree *)0x0) {
        if (uVar15 < uVar9) goto LAB_0012bddf;
LAB_0012be1c:
        iVar7 = getOverflowPage(local_50,pgno,(MemPage **)0x0,&nextPage);
        pBVar12 = local_58;
LAB_0012be39:
        uVar10 = (ulong)(uVar15 - uVar9);
        pgno = nextPage;
        lVar13 = lVar11;
      }
      else {
        *(u32 *)((long)&pBVar5->db + lVar13) = pgno;
        if (uVar9 <= uVar15) {
          PVar3 = *(Pgno *)((long)&pBVar5->db + lVar11);
          if (PVar3 == 0) goto LAB_0012be1c;
          iVar7 = 0;
          nextPage = PVar3;
          goto LAB_0012be39;
        }
LAB_0012bddf:
        uVar17 = (ulong)(uVar9 - uVar15);
        if ((int)uVar18 + uVar15 <= uVar9) {
          uVar17 = uVar18;
        }
        iVar7 = sqlite3PagerAcquire(local_50->pPager,pgno,&pDbPage,local_44);
        pDbPage_00 = pDbPage;
        iVar16 = (int)uVar17;
        if (iVar7 == 0) {
          puVar4 = (u8 *)pDbPage->pData;
          local_40 = uVar18;
          pgno = sqlite3Get4byte(puVar4);
          puVar6 = local_60;
          nextPage = pgno;
          iVar7 = copyPayload(puVar4 + (uVar15 + 4),local_60,iVar16,eOp,pDbPage_00);
          uVar18 = local_40;
          sqlite3PagerUnref(pDbPage_00);
          uVar10 = 0;
          local_60 = puVar6;
        }
        uVar18 = (ulong)(uint)((int)uVar18 - iVar16);
        local_60 = local_60 + iVar16;
        pBVar12 = local_58;
        uVar9 = local_64;
        lVar13 = lVar11;
      }
    }
  }
  if (iVar7 != 0) {
    return iVar7;
  }
  iVar16 = 0xd1a4;
  if ((int)uVar18 == 0) {
    return 0;
  }
LAB_0012bec4:
  sqlite3CorruptError(iVar16);
  return 0xb;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */ 
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  u32 nKey;
  int iIdx = 0;
  MemPage *pPage = pCur->apPage[pCur->iPage]; /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */

  assert( pPage );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->aiIdx[pCur->iPage]<pPage->nCell );
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pCell + pCur->info.nHeader;
  nKey = (pPage->intKey ? 0 : (int)pCur->info.nKey);

  if( NEVER(offset+amt > nKey+pCur->info.nData) 
   || &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
  ){
    /* Trying to read or write past the end of the data is an error */
    return SQLITE_CORRUPT_BKPT;
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }

  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

#ifndef SQLITE_OMIT_INCRBLOB
    /* If the isIncrblobHandle flag is set and the BtCursor.aOverflow[]
    ** has not been allocated, allocate it now. The array is sized at
    ** one entry for each overflow page in the overflow chain. The
    ** page number of the first overflow page is stored in aOverflow[0],
    ** etc. A value of 0 in the aOverflow[] array means "not yet known"
    ** (the cache is lazily populated).
    */
    if( pCur->isIncrblobHandle && !pCur->aOverflow ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      pCur->aOverflow = (Pgno *)sqlite3MallocZero(sizeof(Pgno)*nOvfl);
      /* nOvfl is always positive.  If it were zero, fetchPayload would have
      ** been used instead of this routine. */
      if( ALWAYS(nOvfl) && !pCur->aOverflow ){
        rc = SQLITE_NOMEM;
      }
    }

    /* If the overflow page-list cache has been allocated and the
    ** entry for the first required overflow page is valid, skip
    ** directly to it.
    */
    if( pCur->aOverflow && pCur->aOverflow[offset/ovflSize] ){
      iIdx = (offset/ovflSize);
      nextPage = pCur->aOverflow[iIdx];
      offset = (offset%ovflSize);
    }
#endif

    for( ; rc==SQLITE_OK && amt>0 && nextPage; iIdx++){

#ifndef SQLITE_OMIT_INCRBLOB
      /* If required, populate the overflow page-list cache. */
      if( pCur->aOverflow ){
        assert(!pCur->aOverflow[iIdx] || pCur->aOverflow[iIdx]==nextPage);
        pCur->aOverflow[iIdx] = nextPage;
      }
#endif

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
#ifndef SQLITE_OMIT_INCRBLOB
        if( pCur->aOverflow && pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        } else 
#endif
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
        sqlite3_file *fd;
#endif
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and 
        **   2) data is required from the start of this overflow page, and
        **   3) the database is file-backed, and
        **   4) there is no open write-transaction, and
        **   5) the database is not a WAL database,
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && pBt->inTransaction==TRANS_READ                     /* (4) */
         && (fd = sqlite3PagerFile(pBt->pPager))->pMethods     /* (3) */
         && pBt->pPage1->aData[19]==0x01                       /* (5) */
        ){
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerAcquire(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_ACQUIRE_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        pBuf += a;
      }
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  return rc;
}